

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_dophase_done(Curl_easy *data,_Bool connected)

{
  undefined1 *puVar1;
  byte *pbVar2;
  connectdata *pcVar3;
  FILEPROTO *pFVar4;
  CURLcode CVar5;
  undefined7 in_register_00000031;
  int completed;
  int local_24;
  
  pcVar3 = data->conn;
  pFVar4 = (data->req).p.file;
  if ((int)CONCAT71(in_register_00000031,connected) == 0) {
    if (pFVar4->fd == 0) {
      puVar1 = &(pcVar3->bits).field_0x1;
      *puVar1 = *puVar1 | 0x10;
      goto LAB_0012a9da;
    }
  }
  else {
    CVar5 = ftp_do_more(data,&local_24);
    if (CVar5 != CURLE_OK) {
      close_secondarysocket(data);
      return CVar5;
    }
    if (pFVar4->fd == 0) goto LAB_0012a9da;
  }
  Curl_xfer_setup_nop(data);
LAB_0012a9da:
  pbVar2 = (byte *)((long)&pcVar3->proto + 0x112);
  *pbVar2 = *pbVar2 | 4;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_dophase_done(struct Curl_easy *data, bool connected)
{
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(connected) {
    int completed;
    CURLcode result = ftp_do_more(data, &completed);

    if(result) {
      close_secondarysocket(data);
      return result;
    }
  }

  if(ftp->transfer != PPTRANSFER_BODY)
    /* no data to transfer */
    Curl_xfer_setup_nop(data);
  else if(!connected)
    /* since we did not connect now, we want do_more to get called */
    conn->bits.do_more = TRUE;

  ftpc->ctl_valid = TRUE; /* seems good */

  return CURLE_OK;
}